

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::tree_node<char,_true>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<char,true,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_true>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  ref<immutable::rrb_details::internal_node<char,_true>_> *prVar4;
  int iVar5;
  internal_node<char,_true> *piVar6;
  rrb_size_table<true> *prVar7;
  leaf_node<char,_true> *plVar8;
  byte bVar9;
  uint local_dc;
  uint32_t i_3;
  ref<immutable::rrb_details::leaf_node<char,_true>_> right_vals;
  uint32_t right_vals_len;
  ref<immutable::rrb_details::leaf_node<char,_true>_> leaf_root;
  uint32_t i_2;
  uint32_t i_1;
  ref<immutable::rrb_details::rrb_size_table<true>_> sliced_table_1;
  ref<immutable::rrb_details::rrb_size_table<true>_> table_1;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<char,_true>_> sliced_root;
  uint32_t sliced_len;
  ref<immutable::rrb_details::rrb_size_table<true>_> sliced_table;
  ref<immutable::rrb_details::internal_node<char,_true>_> internal_left_hand_node;
  ref<immutable::rrb_details::internal_node<char,_true>_> left_hand_parent;
  ref<immutable::rrb_details::tree_node<char,_true>_> left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_true>_> local_60;
  ref<immutable::rrb_details::tree_node<char,_true>_> child;
  uint32_t last_slot;
  rrb_size_table<true> *table;
  uint32_t idx;
  ref<immutable::rrb_details::internal_node<char,_true>_> internal_root;
  uint32_t subidx;
  uint32_t subshift;
  bool has_right_local;
  uint32_t shift_local;
  uint32_t left_local;
  ref<immutable::rrb_details::tree_node<char,_true>_> *root_local;
  uint32_t *total_shift_local;
  
  bVar9 = (byte)shift;
  internal_root.ptr._4_4_ = left >> (bVar9 & 0x1f);
  if (shift == 0) {
    ref<immutable::rrb_details::leaf_node<char,true>>::
    ref<immutable::rrb_details::tree_node<char,true>>
              ((ref<immutable::rrb_details::leaf_node<char,true>> *)&stack0xffffffffffffff38,root);
    plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)
                        &stack0xffffffffffffff38);
    right_vals.ptr._4_4_ = plVar8->len - internal_root.ptr._4_4_;
    plVar8 = leaf_node_create<char,true>(right_vals.ptr._4_4_);
    ref<immutable::rrb_details::leaf_node<char,_true>_>::ref
              ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffff28,
               plVar8);
    for (local_dc = 0; local_dc < right_vals.ptr._4_4_; local_dc = local_dc + 1) {
      plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)
                          &stack0xffffffffffffff38);
      cVar1 = plVar8->child[internal_root.ptr._4_4_ + local_dc];
      plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)
                          &stack0xffffffffffffff28);
      plVar8->child[local_dc] = cVar1;
    }
    *total_shift = 0;
    ref<immutable::rrb_details::tree_node<char,true>>::
    ref<immutable::rrb_details::leaf_node<char,true>>
              ((ref<immutable::rrb_details::tree_node<char,true>> *)this,
               (ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffff28);
    sliced_root.ptr._4_4_ = 1;
    ref<immutable::rrb_details::leaf_node<char,_true>_>::~ref
              ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffff28);
    ref<immutable::rrb_details::leaf_node<char,_true>_>::~ref
              ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffff38);
  }
  else {
    ref<immutable::rrb_details::internal_node<char,true>>::
    ref<immutable::rrb_details::tree_node<char,true>>
              ((ref<immutable::rrb_details::internal_node<char,true>> *)&stack0xffffffffffffffc0,
               root);
    piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                        &stack0xffffffffffffffc0);
    if ((piVar6->size_table).ptr == (rrb_size_table<true> *)0x0) {
      table._4_4_ = left - (internal_root.ptr._4_4_ << (bVar9 & 0x1f));
    }
    else {
      piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                          &stack0xffffffffffffffc0);
      prVar7 = (piVar6->size_table).ptr;
      for (; prVar7->size[internal_root.ptr._4_4_] <= left;
          internal_root.ptr._4_4_ = internal_root.ptr._4_4_ + 1) {
      }
      table._4_4_ = left;
      if (internal_root.ptr._4_4_ != 0) {
        table._4_4_ = left - prVar7->size[internal_root.ptr._4_4_ - 1];
      }
    }
    piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                        &stack0xffffffffffffffc0);
    child.ptr._4_4_ = piVar6->len - 1;
    piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                        &stack0xffffffffffffffc0);
    ref<immutable::rrb_details::tree_node<char,true>>::
    ref<immutable::rrb_details::internal_node<char,true>>
              ((ref<immutable::rrb_details::tree_node<char,true>> *)&local_60,
               piVar6->child + internal_root.ptr._4_4_);
    rrb_drop_left_rec<char,true,5>
              ((rrb_details *)&left_hand_parent,total_shift,&local_60,table._4_4_,shift - 5,
               internal_root.ptr._4_4_ != child.ptr._4_4_ || has_right);
    if (internal_root.ptr._4_4_ == child.ptr._4_4_) {
      if (has_right) {
        piVar6 = internal_node_create<char,true>(1);
        ref<immutable::rrb_details::internal_node<char,_true>_>::ref
                  (&internal_left_hand_node,piVar6);
        ref<immutable::rrb_details::internal_node<char,true>>::
        ref<immutable::rrb_details::tree_node<char,true>>
                  ((ref<immutable::rrb_details::internal_node<char,true>> *)&sliced_table,
                   (ref<immutable::rrb_details::tree_node<char,_true>_> *)&left_hand_parent);
        piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                           (&internal_left_hand_node);
        ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                  (piVar6->child,
                   (ref<immutable::rrb_details::internal_node<char,_true>_> *)&sliced_table);
        if ((shift - 5 != 0) &&
           (piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                               ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                                &sliced_table),
           (piVar6->size_table).ptr != (rrb_size_table<true> *)0x0)) {
          prVar7 = size_table_create<true>(1);
          ref<immutable::rrb_details::rrb_size_table<true>_>::ref
                    ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&sliced_len,prVar7);
          piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                              &sliced_table);
          prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                             (&piVar6->size_table);
          puVar3 = prVar7->size;
          piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                              &sliced_table);
          uVar2 = puVar3[piVar6->len - 1];
          prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                             ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&sliced_len);
          *prVar7->size = uVar2;
          piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                             (&internal_left_hand_node);
          ref<immutable::rrb_details::rrb_size_table<true>_>::operator=
                    (&piVar6->size_table,
                     (ref<immutable::rrb_details::rrb_size_table<true>_> *)&sliced_len);
          ref<immutable::rrb_details::rrb_size_table<true>_>::~ref
                    ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&sliced_len);
        }
        *total_shift = shift;
        ref<immutable::rrb_details::tree_node<char,true>>::
        ref<immutable::rrb_details::internal_node<char,true>>
                  ((ref<immutable::rrb_details::tree_node<char,true>> *)this,
                   &internal_left_hand_node);
        sliced_root.ptr._4_4_ = 1;
        ref<immutable::rrb_details::internal_node<char,_true>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<char,_true>_> *)&sliced_table);
        ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&internal_left_hand_node);
      }
      else {
        ref<immutable::rrb_details::tree_node<char,_true>_>::ref
                  ((ref<immutable::rrb_details::tree_node<char,_true>_> *)this,
                   (ref<immutable::rrb_details::tree_node<char,_true>_> *)&left_hand_parent);
        sliced_root.ptr._4_4_ = 1;
      }
    }
    else {
      piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                          &stack0xffffffffffffffc0);
      sliced_root.ptr._0_4_ = piVar6->len - internal_root.ptr._4_4_;
      piVar6 = internal_node_create<char,true>((uint32_t)sliced_root.ptr);
      ref<immutable::rrb_details::internal_node<char,_true>_>::ref
                ((ref<immutable::rrb_details::internal_node<char,_true>_> *)&stack0xffffffffffffff60
                 ,piVar6);
      for (table_1.ptr._4_4_ = 0; table_1.ptr._4_4_ < (uint32_t)sliced_root.ptr - 1;
          table_1.ptr._4_4_ = table_1.ptr._4_4_ + 1) {
        piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                            &stack0xffffffffffffffc0);
        prVar4 = piVar6->child;
        iVar5 = internal_root.ptr._4_4_ + 1;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                            &stack0xffffffffffffff60);
        ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                  (piVar6->child + (table_1.ptr._4_4_ + 1),prVar4 + (iVar5 + table_1.ptr._4_4_));
      }
      piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                          &stack0xffffffffffffffc0);
      ref<immutable::rrb_details::rrb_size_table<true>_>::ref(&sliced_table_1,&piVar6->size_table);
      prVar7 = size_table_create<true>((uint32_t)sliced_root.ptr);
      ref<immutable::rrb_details::rrb_size_table<true>_>::ref
                ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&i_2,prVar7);
      if (sliced_table_1.ptr == (rrb_size_table<true> *)0x0) {
        for (leaf_root.ptr._4_4_ = 0; leaf_root.ptr._4_4_ < (uint32_t)sliced_root.ptr;
            leaf_root.ptr._4_4_ = leaf_root.ptr._4_4_ + 1) {
          iVar5 = internal_root.ptr._4_4_ + 1 + leaf_root.ptr._4_4_;
          prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                             ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&i_2);
          prVar7->size[leaf_root.ptr._4_4_] = iVar5 << (bVar9 & 0x1f);
        }
      }
      else {
        prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&i_2);
        puVar3 = prVar7->size;
        prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&sliced_table_1);
        memcpy(puVar3,prVar7->size + internal_root.ptr._4_4_,(ulong)(uint32_t)sliced_root.ptr << 2);
      }
      for (leaf_root.ptr._0_4_ = 0; (uint)leaf_root.ptr < (uint32_t)sliced_root.ptr;
          leaf_root.ptr._0_4_ = (uint)leaf_root.ptr + 1) {
        prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&i_2);
        prVar7->size[(uint)leaf_root.ptr] = prVar7->size[(uint)leaf_root.ptr] - left;
      }
      piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                          &stack0xffffffffffffff60);
      ref<immutable::rrb_details::rrb_size_table<true>_>::operator=
                (&piVar6->size_table,(ref<immutable::rrb_details::rrb_size_table<true>_> *)&i_2);
      piVar6 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                          &stack0xffffffffffffff60);
      ref<immutable::rrb_details::internal_node<char,true>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,true>> *)piVar6->child,
                 (ref<immutable::rrb_details::tree_node<char,_true>_> *)&left_hand_parent);
      *total_shift = shift;
      ref<immutable::rrb_details::tree_node<char,true>>::
      ref<immutable::rrb_details::internal_node<char,true>>
                ((ref<immutable::rrb_details::tree_node<char,true>> *)this,
                 (ref<immutable::rrb_details::internal_node<char,_true>_> *)&stack0xffffffffffffff60
                );
      sliced_root.ptr._4_4_ = 1;
      ref<immutable::rrb_details::rrb_size_table<true>_>::~ref
                ((ref<immutable::rrb_details::rrb_size_table<true>_> *)&i_2);
      ref<immutable::rrb_details::rrb_size_table<true>_>::~ref(&sliced_table_1);
      ref<immutable::rrb_details::internal_node<char,_true>_>::~ref
                ((ref<immutable::rrb_details::internal_node<char,_true>_> *)&stack0xffffffffffffff60
                );
    }
    ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
              ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&left_hand_parent);
    ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&local_60);
    ref<immutable::rrb_details::internal_node<char,_true>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_true>_> *)&stack0xffffffffffffffc0);
  }
  return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }